

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool libcellml::hasUnitsImports(UnitsPtr *units)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  size_t sVar4;
  ulong uVar5;
  element_type *this;
  string *name;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  string reference;
  size_t index;
  size_t unistCount;
  shared_ptr<const_libcellml::ParentedEntity> local_38;
  undefined1 local_28 [8];
  ModelPtr model;
  bool importPresent;
  UnitsPtr *units_local;
  
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)units);
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       ImportedEntity::isImport(&peVar3->super_ImportedEntity);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_38,units);
  owningModel((libcellml *)local_28,(ParentedEntityConstPtr *)&local_38);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_38);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)units);
  sVar4 = Units::unitCount(peVar3);
  for (reference.field_2._8_8_ = 0;
      bVar1 = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._7_1_,
      (model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _7_1_ & 1) == 0 && (ulong)reference.field_2._8_8_ < sVar4;
      reference.field_2._8_8_ = reference.field_2._8_8_ + 1) {
    peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    Units::unitAttributeReference_abi_cxx11_((string *)local_78,peVar3,reference.field_2._8_8_);
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) && (bVar2 = isStandardUnitName((string *)local_78), !bVar2)) {
      this = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
      bVar2 = Model::hasUnits(this,(string *)local_78);
      if (bVar2) {
        name = (string *)
               std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        Model::units((Model *)local_88,name);
        model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _7_1_ = hasUnitsImports((UnitsPtr *)local_88);
        std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_88);
      }
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_28);
  return (bool)(bVar1 & 1);
}

Assistant:

bool hasUnitsImports(const UnitsPtr &units)
{
    bool importPresent = units->isImport();
    auto model = owningModel(units);
    size_t unistCount = units->unitCount();
    for (size_t index = 0; !importPresent && (index < unistCount); ++index) {
        std::string reference = units->unitAttributeReference(index);
        if (!reference.empty() && !isStandardUnitName(reference)) {
            if (model->hasUnits(reference)) {
                importPresent = hasUnitsImports(model->units(reference));
            }
        }
    }
    return importPresent;
}